

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bezier.cpp
# Opt level: O1

pair<Polynomial,_Polynomial> * __thiscall
Bezier::P2d(pair<Polynomial,_Polynomial> *__return_storage_ptr__,Bezier *this,int l,int n)

{
  double *__x;
  double *__y;
  pair<Polynomial,_Polynomial> rhs;
  pair<Polynomial,_Polynomial> lhs;
  Polynomial local_188;
  Polynomial local_168;
  Polynomial local_148;
  Polynomial local_130;
  Polynomial local_118;
  Polynomial local_100;
  Polynomial local_e8;
  Polynomial local_d0;
  Polynomial local_b8;
  Polynomial local_a0;
  pair<Polynomial,_Polynomial> local_88;
  pair<Polynomial,_Polynomial> local_58;
  
  if (n == 1) {
    __x = Vector3::operator[]((this->control_points).
                              super__Vector_base<Vector3,_std::allocator<Vector3>_>._M_impl.
                              super__Vector_impl_data._M_start + l,0);
    __y = Vector3::operator[]((this->control_points).
                              super__Vector_base<Vector3,_std::allocator<Vector3>_>._M_impl.
                              super__Vector_impl_data._M_start + l,1);
    std::pair<Polynomial,_Polynomial>::pair<double_&,_double_&,_true>
              (__return_storage_ptr__,__x,__y);
  }
  else {
    P2d(&local_58,this,l,n + -1);
    P2d(&local_88,this,l + 1,n + -1);
    Polynomial::Polynomial(&local_b8,1.0,-1.0);
    Polynomial::operator*(&local_a0,&local_b8,&local_58.first);
    Polynomial::Polynomial(&local_e8,0.0,1.0);
    Polynomial::operator*(&local_d0,&local_e8,&local_88.first);
    Polynomial::operator+(&local_188,&local_a0,&local_d0);
    Polynomial::Polynomial(&local_118,1.0,-1.0);
    Polynomial::operator*(&local_100,&local_118,&local_58.second);
    Polynomial::Polynomial(&local_148,0.0,1.0);
    Polynomial::operator*(&local_130,&local_148,&local_88.second);
    Polynomial::operator+(&local_168,&local_100,&local_130);
    (__return_storage_ptr__->first).c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_188.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->first).c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_188.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->first).c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_188.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_188.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_188.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_188.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (__return_storage_ptr__->second).c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_168.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->second).c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_168.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->second).c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_168.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_168.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_168.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_168.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    if (local_130.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_130.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_148.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_148.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_100.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_100.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_118.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_118.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_188.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_188.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_d0.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d0.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_e8.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e8.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_a0.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_b8.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_88.second.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.second.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_88.first.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.first.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_58.second.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.second.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_58.first.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.first.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<Polynomial, Polynomial> Bezier::P2d(int l, int n)
{
    if (n == 1)
        return std::pair<Polynomial, Polynomial>(control_points[l][0], control_points[l][1]);
    std::pair<Polynomial, Polynomial> lhs = P2d(l, n - 1), rhs = P2d(l + 1, n - 1);
    return std::pair<Polynomial, Polynomial>(Polynomial(1, -1) * lhs.first  + Polynomial(0, 1) * rhs.first,
                                             Polynomial(1, -1) * lhs.second + Polynomial(0, 1) * rhs.second);
}